

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O1

uint UFPC::MemMerge(uint i,uint j)

{
  pointer puVar1;
  pointer piVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  uint *puVar7;
  
  piVar2 = mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(int)i];
  mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[(int)i] = iVar3 + 1;
  uVar5 = i;
  if (puVar1[(int)i] < i) {
    piVar6 = piVar2 + (int)i;
    puVar7 = puVar1 + (int)i;
    do {
      *piVar6 = iVar3 + 2;
      uVar5 = *puVar7;
      piVar6 = piVar2 + (int)uVar5;
      iVar3 = *piVar6;
      *piVar6 = iVar3 + 1;
      puVar7 = puVar1 + (int)uVar5;
    } while (*puVar7 < uVar5);
  }
  if (i != j) {
    iVar3 = piVar2[(int)j];
    piVar2[(int)j] = iVar3 + 1;
    uVar4 = j;
    if (puVar1[(int)j] < j) {
      piVar6 = piVar2 + (int)j;
      puVar7 = puVar1 + (int)j;
      do {
        *piVar6 = iVar3 + 2;
        uVar4 = *puVar7;
        piVar6 = piVar2 + (int)uVar4;
        iVar3 = *piVar6;
        *piVar6 = iVar3 + 1;
        puVar7 = puVar1 + (int)uVar4;
      } while (*puVar7 < uVar4);
    }
    if (uVar5 < uVar4) {
      uVar4 = uVar5;
    }
    uVar5 = uVar4;
    piVar6 = piVar2 + (int)j;
    iVar3 = *piVar6;
    *piVar6 = iVar3 + 1;
    puVar7 = puVar1 + (int)j;
    if (*puVar7 < j) {
      do {
        *piVar6 = iVar3 + 2;
        uVar4 = *puVar7;
        *piVar6 = iVar3 + 3;
        *puVar7 = uVar5;
        piVar6 = piVar2 + (int)uVar4;
        iVar3 = *piVar6;
        *piVar6 = iVar3 + 1;
        puVar7 = puVar1 + (int)uVar4;
      } while (*puVar7 < uVar4);
    }
    *piVar6 = iVar3 + 2;
    *puVar7 = uVar5;
  }
  piVar6 = piVar2 + (int)i;
  iVar3 = *piVar6;
  *piVar6 = iVar3 + 1;
  puVar7 = puVar1 + (int)i;
  if (*puVar7 < i) {
    do {
      *piVar6 = iVar3 + 2;
      uVar4 = *puVar7;
      *piVar6 = iVar3 + 3;
      *puVar7 = uVar5;
      piVar6 = piVar2 + (int)uVar4;
      iVar3 = *piVar6;
      *piVar6 = iVar3 + 1;
      puVar7 = puVar1 + (int)uVar4;
    } while (*puVar7 < uVar4);
  }
  *piVar6 = iVar3 + 2;
  *puVar7 = uVar5;
  return uVar5;
}

Assistant:

static unsigned MemMerge(unsigned i, unsigned j)
    {
        // FindRoot(i)
        unsigned root(i);
        while (mem_P_[root] < root) {
            root = mem_P_[root];
        }
        if (i != j) {
            // FindRoot(j)
            unsigned root_j(j);
            while (mem_P_[root_j] < root_j) {
                root_j = mem_P_[root_j];
            }
            if (root > root_j) {
                root = root_j;
            }
            // SetRoot(j, root);
            while (mem_P_[j] < j) {
                unsigned t = mem_P_[j];
                mem_P_[j] = root;
                j = t;
            }
            mem_P_[j] = root;
        }
        // SetRoot(i, root);
        while (mem_P_[i] < i) {
            unsigned t = mem_P_[i];
            mem_P_[i] = root;
            i = t;
        }
        mem_P_[i] = root;
        return root;
    }